

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

lyd_node * lyd_attr_parent(lyd_node *root,lyd_attr *attr)

{
  lyd_node **pplVar1;
  lyd_node *plVar2;
  lyd_node *plVar3;
  lyd_attr *plVar4;
  lyd_node *next;
  
  plVar2 = root;
  if (root == (lyd_node *)0x0) {
    return (lyd_node *)0x0;
  }
  while( true ) {
    do {
      plVar3 = plVar2;
      for (plVar4 = plVar3->attr; plVar4 != (lyd_attr *)0x0; plVar4 = plVar4->next) {
        if (plVar4 == attr) {
          return plVar3;
        }
      }
    } while (((plVar3->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) &&
            (plVar2 = plVar3->child, plVar3->child != (lyd_node *)0x0));
    if (plVar3 == root) break;
    plVar2 = plVar3->next;
    if (plVar3->next == (lyd_node *)0x0) {
      plVar3 = plVar3->parent;
      do {
        if (plVar3->parent == root->parent) {
          return (lyd_node *)0x0;
        }
        pplVar1 = &plVar3->next;
        plVar3 = plVar3->parent;
        plVar2 = *pplVar1;
      } while (*pplVar1 == (lyd_node *)0x0);
    }
  }
  return (lyd_node *)0x0;
}

Assistant:

const struct lyd_node *
lyd_attr_parent(const struct lyd_node *root, struct lyd_attr *attr)
{
    const struct lyd_node *next, *elem;
    struct lyd_attr *node_attr;

    LY_TREE_DFS_BEGIN(root, next, elem) {
        for (node_attr = elem->attr; node_attr; node_attr = node_attr->next) {
            if (node_attr == attr) {
                return elem;
            }
        }
        LY_TREE_DFS_END(root, next, elem)
    }

    return NULL;
}